

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall kj::Own<capnp::Capability::Server>::dispose(Own<capnp::Capability::Server> *this)

{
  Server *object;
  Server *ptrCopy;
  Own<capnp::Capability::Server> *this_local;
  
  object = this->ptr;
  if (object != (Server *)0x0) {
    this->ptr = (Server *)0x0;
    Disposer::dispose<capnp::Capability::Server>(this->disposer,object);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      disposer->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
  }